

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O2

void __thiscall UIDisplayer::drawGameplayScreen(UIDisplayer *this,World *world)

{
  PrimitiveDisplayer *pPVar1;
  UIDisplayer *this_00;
  World *this_01;
  Colour *pCVar2;
  Vec2d *this_02;
  Tetromino *pTVar3;
  TetrominoType *this_03;
  Colour *pCVar4;
  ostream *this_04;
  int i;
  int iVar5;
  Drawable *drawable;
  undefined1 local_260 [8];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined8 auStack_240 [45];
  Vec2d local_d8;
  Vec2d local_d0;
  Vec2d local_c8;
  Vec2d local_c0;
  Vec2d local_b8;
  Vec2d local_b0;
  Vec2d local_a8;
  Vec2d local_a0;
  Vec2d local_98;
  Vec2d local_90;
  Vec2d local_88;
  Vec2d local_80;
  Vec2d local_78;
  UIDisplayer *local_70;
  World *local_68;
  string local_60;
  Colour *local_40;
  float local_38;
  allocator local_31;
  
  local_68 = world;
  local_40 = Palette::getColour(this->palette,8);
  Palette::getColour(this->palette,1);
  Palette::getColour(this->palette,8);
  pPVar1 = this->primitiveDisplayer;
  local_70 = this;
  Vec2d::Vec2d(&local_d8,30.0,30.0);
  Vec2d::Vec2d(&local_d0,300.0,600.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_d8,local_d0,local_40);
  glPushMatrix();
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f000000);
  glTranslatef(0x3f800000,0x3f800000,0);
  for (iVar5 = 1; iVar5 != 10; iVar5 = iVar5 + 1) {
    glPushMatrix();
    glTranslatef(0x41f00000,0,0);
    glLineWidth(*(undefined4 *)(&DAT_001241a0 + (ulong)(iVar5 == 5) * 4));
    glBegin(1);
    local_38 = (float)iVar5 * 30.0;
    glVertex2f();
    glVertex2f(local_38);
    glEnd();
    glPopMatrix();
  }
  iVar5 = 1;
  while( true ) {
    if (iVar5 == 0x14) break;
    glPushMatrix();
    glTranslatef(0,0x41f00000,0);
    glLineWidth(*(undefined4 *)
                 (&DAT_001241a0 +
                 (ulong)((char)((char)(((ushort)iVar5 & 0xff) / 5) * -5 + (char)iVar5) == '\0') * 4)
               );
    glBegin(1);
    local_38 = (float)iVar5 * 30.0;
    glVertex2f();
    glVertex2f(0x43a50000,local_38);
    glEnd();
    glPopMatrix();
    iVar5 = iVar5 + 1;
  }
  glPopMatrix();
  this_00 = local_70;
  pPVar1 = local_70->primitiveDisplayer;
  Vec2d::Vec2d(&local_c8,360.0,30.0);
  Vec2d::Vec2d(&local_c0,270.0,120.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_c8,local_c0,local_40);
  Vec2d::Vec2d(&local_a8,372.0,44.0);
  std::__cxx11::string::string((string *)local_260,"NEXT",(allocator *)&local_60);
  pCVar2 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_a8,(string *)local_260,4.0,pCVar2,false);
  std::__cxx11::string::~string((string *)local_260);
  glPushMatrix();
  this_02 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_02,0.0,20.0);
  glTranslatef(0x43ff0000,0x43070000,0);
  this_01 = local_68;
  pPVar1 = this_00->primitiveDisplayer;
  pTVar3 = World::getNextTet(local_68);
  drawable = &pTVar3->super_Drawable;
  if (pTVar3 == (Tetromino *)0x0) {
    drawable = (Drawable *)0x0;
  }
  pTVar3 = World::getNextTet(this_01);
  this_03 = Tetromino::getType(pTVar3);
  iVar5 = TetrominoType::getDisplayRotation(this_03);
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,drawable,(float)iVar5,this_02);
  operator_delete(this_02);
  glPopMatrix();
  pPVar1 = this_00->primitiveDisplayer;
  Vec2d::Vec2d(&local_b8,360.0,180.0);
  Vec2d::Vec2d(&local_b0,270.0,120.0);
  pCVar2 = local_40;
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_b8,local_b0,local_40);
  Vec2d::Vec2d(&local_a0,372.0,194.0);
  std::__cxx11::string::string((string *)local_260,"SCORE",(allocator *)&local_60);
  pCVar4 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_a0,(string *)local_260,4.0,pCVar4,false);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::stringstream::stringstream((stringstream *)local_260);
  *(undefined8 *)((long)auStack_240 + *(long *)(local_250._M_allocated_capacity - 0x18)) = 6;
  this_04 = std::operator<<(&local_250,0x30);
  iVar5 = World::getScore(local_68);
  std::ostream::operator<<(this_04,iVar5);
  Vec2d::Vec2d(&local_98,372.0,236.0);
  std::__cxx11::stringbuf::str();
  pCVar4 = Palette::getColour(this_00->palette,0);
  drawParagraphAtCoords(this_00,local_98,&local_60,7.0,pCVar4,true);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar1 = this_00->primitiveDisplayer;
  Vec2d::Vec2d(&local_90,360.0,510.0);
  Vec2d::Vec2d(&local_88,270.0,120.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar1,local_90,local_88,pCVar2);
  Vec2d::Vec2d(&local_80,448.0,524.0);
  std::__cxx11::string::string((string *)&local_60,"LANA",&local_31);
  pCVar2 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_80,&local_60,4.0,pCVar2,false);
  std::__cxx11::string::~string((string *)&local_60);
  Vec2d::Vec2d(&local_78,372.0,566.0);
  std::__cxx11::string::string((string *)&local_60,"TETRIS",&local_31);
  pCVar2 = Palette::getColour(this_00->palette,0);
  drawParagraphAtCoords(this_00,local_78,&local_60,7.0,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_260);
  return;
}

Assistant:

void UIDisplayer::drawGameplayScreen(World* world) {
    GLfloat blockSize = 30;

    Colour* borderColour = palette->getColour(Palette::WHITE);
    Colour* shapeColour = palette->getColour(Palette::ORANGE);
    Colour* shapeLineColour = palette->getColour(Palette::WHITE);
    
    // field
    primitiveDisplayer->drawRectangleOutline(Vec2d(blockSize, blockSize), Vec2d(10 * blockSize, 20 * blockSize), borderColour);
    
    //grid
    glPushMatrix();
        glColor4f(1.f, 1.f, 1.f, 0.5f);
        glTranslatef(1, 1, 0);
        for (int i = 1; i < 10; i++) {
            glPushMatrix();
                glTranslatef(blockSize, 0, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(i*blockSize, blockSize);
                    glVertex2f(i*blockSize, 21 * blockSize);
                glEnd();
            glPopMatrix();
        }
        for (int i = 1; i < 20; i++) {
            glPushMatrix();
                glTranslatef(0, blockSize, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(blockSize, i*blockSize);
                    glVertex2f(11*blockSize, i* blockSize);
                glEnd();
            glPopMatrix();
        }
    glPopMatrix();
    
    // next shape
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, blockSize + 14), "NEXT", 4, palette->getColour(Palette::PINK), false);
    
    glPushMatrix();
        Vec2d* newShapePos = new Vec2d(0, 20);
        glTranslatef(17 * blockSize, 4.5 * blockSize, 0.f);
        primitiveDisplayer->drawableWithGLRotation(world->getNextTet(), world->getNextTet()->getType()->getDisplayRotation(), newShapePos);
        delete newShapePos;
        newShapePos = nullptr;
    glPopMatrix();

    
    // score
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 6 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 6 * blockSize + 14), "SCORE", 4, palette->getColour(Palette::PINK), false);
    
    stringstream ss;
    ss << setw(6) << setfill('0') << world->getScore();
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 7 * blockSize + 26), ss.str(), 7, palette->getColour(Palette::GREEN), true);
    
    // logo
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 17 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 88, 17 * blockSize + 14), "LANA", 4, palette->getColour(Palette::PINK), false);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 18 * blockSize + 26), "TETRIS", 7, palette->getColour(Palette::GREEN), true);
    
    borderColour = nullptr;
    shapeColour = nullptr;
    shapeLineColour = nullptr;
}